

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O0

void __thiscall HashMap<int>::insert(HashMap<int> *this,uint hash,int value)

{
  bool bVar1;
  int iVar2;
  Node **ppNVar3;
  undefined4 extraout_var;
  Node *local_28;
  Node *n;
  uint bucket;
  int value_local;
  uint hash_local;
  HashMap<int> *this_local;
  
  bVar1 = SmallArray<HashMap<int>::Node_*,_32U>::empty(&this->freeList);
  if (bVar1) {
    if (this->allocator == (Allocator *)0x0) {
      local_28 = (Node *)ChunkedStackPool<4092>::Allocate(&this->nodePool,0x10);
    }
    else {
      iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x10);
      local_28 = (Node *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    ppNVar3 = SmallArray<HashMap<int>::Node_*,_32U>::back(&this->freeList);
    local_28 = *ppNVar3;
    SmallArray<HashMap<int>::Node_*,_32U>::pop_back(&this->freeList);
  }
  local_28->value = value;
  local_28->hash = hash;
  local_28->next = this->entries[hash & 0x3ff];
  this->entries[hash & 0x3ff] = local_28;
  return;
}

Assistant:

void insert(unsigned int hash, Value value)
	{
		unsigned int bucket = hash & bucketMask;

		Node *n = NULL;

		if(!freeList.empty())
		{
			n = freeList.back();
			freeList.pop_back();
		}
		else
		{
			if(allocator)
				n = (Node*)allocator->alloc(sizeof(Node));
			else
				n = (Node*)nodePool.Allocate(sizeof(Node));
		}

		n->value = value;
		n->hash = hash;
		n->next = entries[bucket];
		entries[bucket] = n;
	}